

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O0

nhrect * get_rect(nhrect *r)

{
  int local_34;
  int i;
  int hy;
  int hx;
  int ly;
  int lx;
  nhrect *rectp;
  nhrect *r_local;
  
  local_34 = 0;
  _ly = rect;
  while( true ) {
    if (rect_cnt <= local_34) {
      return (nhrect *)0x0;
    }
    if ((((_ly->lx <= r->lx) && (_ly->ly <= r->ly)) && (r->hx <= _ly->hx)) && (r->hy <= _ly->hy))
    break;
    local_34 = local_34 + 1;
    _ly = _ly + 1;
  }
  return _ly;
}

Assistant:

struct nhrect *get_rect(struct nhrect *r)
{
	struct nhrect *rectp;
	int lx, ly, hx, hy;
	int i;

	lx = r->lx; ly = r->ly;
	hx = r->hx; hy = r->hy;
	for (i=0,rectp = &rect[0];i<rect_cnt;i++,rectp++)
	    if ( lx >= rectp->lx && ly >= rectp->ly &&
		 hx <= rectp->hx && hy <= rectp->hy)
		return rectp;
	return 0;
}